

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QTest.hpp
# Opt level: O2

void __thiscall Qentem::QTest::afterTest(QTest *this,bool test_for_leaks)

{
  SizeT SVar1;
  SizeT remaining_allocations;
  char *local_28;
  char *local_20;
  
  if (this->error_ == false) {
    local_20 = TestOutPut::GetColor(PASS);
    local_28 = TestOutPut::GetColor(END);
    remaining_allocations = CONCAT31(remaining_allocations._1_3_,10);
    TestOutPut::Print<char_const*,char[5],char_const*,char[3],char_const*,char>
              (&local_20,(char (*) [5])"Pass",&local_28,(char (*) [3])0x11507a,&this->part_name_,
               (char *)&remaining_allocations);
  }
  if (test_for_leaks) {
    SVar1 = MemoryRecord::CheckSubMemory();
    remaining_allocations = SVar1;
    MemoryRecord::ResetSubMemory();
    if (SVar1 != 0) {
      local_20 = TestOutPut::GetColor(ERROR);
      local_28 = TestOutPut::GetColor(END);
      TestOutPut::Print<char_const*,char[14],char_const*,char[3],unsigned_int,char[25]>
                (&local_20,(char (*) [14])"Leak detected",&local_28,(char (*) [3])0x11507a,
                 &remaining_allocations,(char (*) [25])" remaining allocations.\n");
    }
  }
  return;
}

Assistant:

QENTEM_NOINLINE void afterTest(bool test_for_leaks) {
        if (!error_) {
            TestOutPut::Print(TestOutPut::GetColor(TestOutPut::Colors::PASS), "Pass",
                              TestOutPut::GetColor(TestOutPut::Colors::END), ": ", part_name_, '\n');
        }

        if (test_for_leaks) {
            const SizeT remaining_allocations = MemoryRecord::CheckSubMemory();
            MemoryRecord::ResetSubMemory();

            if (remaining_allocations != 0) {
                TestOutPut::Print(TestOutPut::GetColor(TestOutPut::Colors::ERROR), "Leak detected",
                                  TestOutPut::GetColor(TestOutPut::Colors::END), ": ", remaining_allocations,
                                  " remaining allocations.\n");
            }
        }
    }